

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pDrawCallBatchingTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Performance::DrawCallBatchingTests::init(DrawCallBatchingTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  bool *pbVar2;
  TestCaseGroup *pTVar3;
  _Alloc_hider name;
  _func_int **pp_Var4;
  int iVar5;
  int iVar6;
  int iVar7;
  deUint32 seed;
  TestCaseGroup *this_00;
  TestNode *node;
  ostream *poVar8;
  long lVar9;
  byte bVar10;
  char *__rhs;
  uint uVar11;
  long lVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  int drawCallCount;
  TestCaseGroup *local_2c0;
  int local_2b8;
  allocator<char> local_2b1;
  int local_2b0;
  int local_2ac;
  TestCaseGroup *local_2a8;
  TestCaseGroup *local_2a0;
  TestCaseGroup *local_298;
  int local_28c;
  char *local_288;
  ulong local_280;
  ulong local_278;
  ulong local_270;
  long local_268;
  bool *local_260;
  TestCaseGroup *local_258;
  char *local_250;
  char *local_248;
  TestNode *local_240;
  long local_238;
  long local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostream local_1a8;
  
  local_280 = 0;
  local_240 = (TestNode *)this;
  while (iVar5 = (int)local_280, iVar5 != 2) {
    local_288 = "invalid_mode_draw_arrays";
    if (iVar5 == 1) {
      local_288 = "invalid_mode_draw_elements";
    }
    local_288 = local_288 + 0xd;
    for (local_2b0 = 0; iVar6 = (int)local_280, local_2b0 != 2; local_2b0 = local_2b0 + 1) {
      bVar13 = local_2b0 == 1;
      if (!bVar13 || iVar6 == 1) {
        bVar14 = local_2b0 == 1;
        local_260 = glcts::fixed_sample_locations_values + 1;
        if (bVar14) {
          local_260 = (bool *)0x17e5725;
        }
        for (local_2b8 = 0; local_2b8 != 2; local_2b8 = local_2b8 + 1) {
          bVar15 = local_2b8 == 1;
          if (!bVar15 || bVar14 && iVar6 == 1) {
            pbVar2 = glcts::fixed_sample_locations_values;
            if (local_2b8 == 1) {
              pbVar2 = (bool *)"_dynamic_";
            }
            local_2a8 = (TestCaseGroup *)operator_new(0x78);
            pCVar1 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_228,pbVar2 + 1,(allocator<char> *)&drawCallCount);
            std::operator+(&local_1c8,&local_228,local_260);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_1a8,&local_1c8,local_288);
            pp_Var4 = local_1a8._vptr_basic_ostream;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1e8,"Test batched rendering with ",&local_2b1);
            std::operator+(&local_208,&local_1e8,local_288);
            pTVar3 = local_2a8;
            TestCaseGroup::TestCaseGroup
                      (local_2a8,pCVar1,(char *)pp_Var4,local_208._M_dataplus._M_p);
            std::__cxx11::string::~string((string *)&local_208);
            std::__cxx11::string::~string((string *)&local_1e8);
            std::__cxx11::string::~string((string *)&local_1a8);
            std::__cxx11::string::~string((string *)&local_1c8);
            std::__cxx11::string::~string((string *)&local_228);
            tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar3);
            lVar12 = 0;
            while (lVar12 != 2) {
              drawCallCount = (&DAT_0182e0d0)[lVar12];
              local_2c0 = (TestCaseGroup *)operator_new(0x78);
              pCVar1 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
              de::toString<int>(&local_1c8,&drawCallCount);
              __rhs = "_draws";
              if (drawCallCount == 1) {
                __rhs = "_draw";
              }
              local_268 = lVar12;
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_1a8,&local_1c8,__rhs);
              pp_Var4 = local_1a8._vptr_basic_ostream;
              de::toString<int>(&local_1e8,&drawCallCount);
              std::operator+(&local_208,"Test batched rendering performance with ",&local_1e8);
              std::operator+(&local_228,&local_208," draw calls.");
              TestCaseGroup::TestCaseGroup
                        (local_2c0,pCVar1,(char *)pp_Var4,local_228._M_dataplus._M_p);
              std::__cxx11::string::~string((string *)&local_228);
              std::__cxx11::string::~string((string *)&local_208);
              std::__cxx11::string::~string((string *)&local_1e8);
              std::__cxx11::string::~string((string *)&local_1a8);
              std::__cxx11::string::~string((string *)&local_1c8);
              local_2a0 = (TestCaseGroup *)operator_new(0x78);
              TestCaseGroup::TestCaseGroup
                        (local_2a0,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                         "1_attribute","Test draw call batching with 1 attribute.");
              this_00 = (TestCaseGroup *)operator_new(0x78);
              TestCaseGroup::TestCaseGroup
                        (this_00,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                         "8_attributes","Test draw call batching with 8 attributes.");
              pTVar3 = local_2c0;
              tcu::TestNode::addChild((TestNode *)local_2c0,(TestNode *)local_2a0);
              tcu::TestNode::addChild((TestNode *)pTVar3,(TestNode *)this_00);
              tcu::TestNode::addChild((TestNode *)local_2a8,(TestNode *)pTVar3);
              local_258 = this_00;
              for (lVar12 = 0; lVar12 != 5; lVar12 = lVar12 + 1) {
                local_270 = (ulong)(uint)(&DAT_0182e100)[lVar12];
                local_278 = (ulong)(uint)(&DAT_0182e120)[lVar12];
                iVar7 = (&DAT_0182e120)[lVar12] + (&DAT_0182e100)[lVar12];
                local_298 = local_2a0;
                if ((iVar7 != 1) && (local_298 = this_00, iVar7 != 8)) {
                  local_298 = (TestCaseGroup *)0x0;
                }
                bVar16 = lVar12 == 4;
                bVar17 = lVar12 == 1;
                local_248 = "buffers_";
                local_250 = "buffers_";
                if (bVar17) {
                  local_250 = "buffer_";
                }
                bVar18 = lVar12 == 3;
                bVar19 = lVar12 == 0;
                if (bVar19) {
                  local_248 = "buffer_";
                }
                local_238 = lVar12;
                for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
                  local_2ac = (&DAT_0182e0d8)[lVar9];
                  local_230 = lVar9;
                  for (iVar7 = 0; iVar7 != 2; iVar7 = iVar7 + 1) {
                    bVar10 = (byte)iVar7;
                    local_2c0 = (TestCaseGroup *)CONCAT44(local_2c0._4_4_,iVar7);
                    for (uVar11 = 0; uVar11 != 2; uVar11 = uVar11 + 1) {
                      if (((bVar17 || bVar16) & (byte)uVar11) == 0 &&
                          ((bVar19 || bVar18) & bVar10) == 0) {
                        local_28c = drawCallCount;
                        node = (TestNode *)operator_new(0x1d8);
                        pCVar1 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
                        iVar7 = (int)lVar12;
                        if ((iVar7 != 1) && (iVar7 != 4)) {
                          poVar8 = (ostream *)std::ostream::operator<<(&local_1a8,(int)local_270);
                          std::operator<<(poVar8,"_static_");
                        }
                        if ((uVar11 & 1) != 0) {
                          std::operator<<(&local_1a8,local_248);
                        }
                        if ((iVar7 != 0) && (iVar7 != 3)) {
                          poVar8 = (ostream *)std::ostream::operator<<(&local_1a8,(int)local_278);
                          std::operator<<(poVar8,"_dynamic_");
                        }
                        if (((ulong)local_2c0 & 1) != 0) {
                          std::operator<<(&local_1a8,local_250);
                        }
                        poVar8 = (ostream *)std::ostream::operator<<(&local_1a8,local_2ac);
                        std::operator<<(poVar8,"_triangles");
                        std::__cxx11::stringbuf::str();
                        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
                        name._M_p = local_1c8._M_dataplus._M_p;
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_1a8,
                                   "Test performance of batched rendering against non-batched rendering."
                                   ,(allocator<char> *)&local_228);
                        tcu::TestCase::TestCase
                                  ((TestCase *)node,pCVar1->m_testCtx,NODETYPE_PERFORMANCE,name._M_p
                                   ,(char *)local_1a8._vptr_basic_ostream);
                        node->_vptr_TestNode = (_func_int **)&PTR__DrawCallBatchingTest_01e1f5a0;
                        *(undefined4 *)&node[1]._vptr_TestNode = 0;
                        node[1].m_testCtx = (TestContext *)pCVar1->m_renderCtx;
                        seed = deStringHash(name._M_p);
                        deRandom_init((deRandom *)&node[1].m_name,seed);
                        node[1].m_name.field_2._M_allocated_capacity = 0x2200000000;
                        *(undefined4 *)((long)&node[1].m_name.field_2 + 8) = 0x22;
                        node[1].m_name.field_2._M_local_buf[0xc] = (byte)uVar11;
                        *(int *)&node[1].m_description._M_dataplus._M_p = (int)local_270;
                        *(char *)((long)&node[1].m_description._M_dataplus._M_p + 4) =
                             (char)local_2c0;
                        *(int *)&node[1].m_description._M_string_length = (int)local_278;
                        *(int *)((long)&node[1].m_description._M_string_length + 4) = local_2ac;
                        *(int *)&node[1].m_description.field_2 = local_28c;
                        node[1].m_description.field_2._M_local_buf[4] = iVar5 == 1;
                        node[1].m_description.field_2._M_local_buf[5] = bVar13;
                        node[1].m_description.field_2._M_local_buf[6] = bVar15;
                        *(undefined8 *)((long)&node[1].m_description.field_2 + 8) = 0;
                        *(undefined8 *)&node[1].m_nodeType = 0;
                        node[1].m_children.
                        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                        node[1].m_children.
                        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                        node[1].m_children.
                        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                        node[2]._vptr_TestNode = (_func_int **)0x0;
                        node[2].m_testCtx = (TestContext *)0x0;
                        node[2].m_name._M_dataplus._M_p = (pointer)0x0;
                        node[2].m_name._M_string_length = 0;
                        node[2].m_name.field_2._M_allocated_capacity = 0;
                        *(undefined8 *)((long)&node[2].m_name.field_2 + 4) = 0;
                        *(undefined8 *)((long)&node[2].m_name.field_2 + 0xc) = 0;
                        memset(&node[2].m_description._M_string_length,0,0xc0);
                        tcu::TestNode::addChild((TestNode *)local_298,node);
                        std::__cxx11::string::~string((string *)&local_1a8);
                        std::__cxx11::string::~string((string *)&local_1c8);
                        lVar9 = local_230;
                        this = (DrawCallBatchingTests *)local_240;
                        lVar12 = local_238;
                        iVar7 = (int)local_2c0;
                      }
                    }
                    this_00 = local_258;
                  }
                }
              }
              lVar12 = local_268 + 1;
            }
          }
        }
      }
    }
    local_280 = (ulong)(iVar6 + 1);
  }
  return 2;
}

Assistant:

void DrawCallBatchingTests::init (void)
{
	int drawCallCounts[] = {
		10, 100
	};

	int triangleCounts[] = {
		2, 10
	};

	int staticAttributeCounts[] = {
		1, 0, 4, 8, 0
	};

	int dynamicAttributeCounts[] = {
		0, 1, 4, 0, 8
	};

	DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(staticAttributeCounts) == DE_LENGTH_OF_ARRAY(dynamicAttributeCounts));

	for (int drawType = 0; drawType < 2; drawType++)
	{
		bool drawElements = (drawType == 1);

		for (int indexBufferNdx = 0; indexBufferNdx < 2; indexBufferNdx++)
		{
			bool useIndexBuffer = (indexBufferNdx == 1);

			if (useIndexBuffer && !drawElements)
				continue;

			for (int dynamicIndexNdx = 0; dynamicIndexNdx < 2; dynamicIndexNdx++)
			{
				bool dynamicIndices = (dynamicIndexNdx == 1);

				if (dynamicIndices && !drawElements)
					continue;

				if (dynamicIndices && !useIndexBuffer)
					continue;

				TestCaseGroup* drawTypeGroup = new TestCaseGroup(m_context, (string(dynamicIndices ? "dynamic_" : "") + (useIndexBuffer ? "buffer_" : "" ) + (drawElements ? "draw_elements" : "draw_arrays")).c_str(), (string("Test batched rendering with ") + (drawElements ? "draw_elements" : "draw_arrays")).c_str());

				addChild(drawTypeGroup);

				for (int drawCallCountNdx = 0; drawCallCountNdx < DE_LENGTH_OF_ARRAY(drawCallCounts); drawCallCountNdx++)
				{
					int drawCallCount = drawCallCounts[drawCallCountNdx];

					TestCaseGroup*	callCountGroup			= new TestCaseGroup(m_context, (de::toString(drawCallCount) + (drawCallCount == 1 ? "_draw" : "_draws")).c_str(), ("Test batched rendering performance with " + de::toString(drawCallCount) + " draw calls.").c_str());
					TestCaseGroup*	attributeCount1Group	= new TestCaseGroup(m_context, "1_attribute", "Test draw call batching with 1 attribute.");
					TestCaseGroup*	attributeCount8Group	= new TestCaseGroup(m_context, "8_attributes", "Test draw call batching with 8 attributes.");

					callCountGroup->addChild(attributeCount1Group);
					callCountGroup->addChild(attributeCount8Group);

					drawTypeGroup->addChild(callCountGroup);

					for (int attributeCountNdx = 0; attributeCountNdx < DE_LENGTH_OF_ARRAY(dynamicAttributeCounts); attributeCountNdx++)
					{
						TestCaseGroup*	attributeCountGroup		= NULL;

						int				staticAttributeCount	= staticAttributeCounts[attributeCountNdx];
						int				dynamicAttributeCount	= dynamicAttributeCounts[attributeCountNdx];

						if (staticAttributeCount + dynamicAttributeCount == 1)
							attributeCountGroup = attributeCount1Group;
						else if (staticAttributeCount + dynamicAttributeCount == 8)
							attributeCountGroup = attributeCount8Group;
						else
							DE_ASSERT(false);

						for (int triangleCountNdx = 0; triangleCountNdx < DE_LENGTH_OF_ARRAY(triangleCounts); triangleCountNdx++)
						{
							int triangleCount = triangleCounts[triangleCountNdx];

							for (int dynamicBufferNdx = 0; dynamicBufferNdx < 2; dynamicBufferNdx++)
							{
								bool useDynamicBuffer = (dynamicBufferNdx != 0);

								for (int staticBufferNdx = 0; staticBufferNdx < 2; staticBufferNdx++)
								{
									bool useStaticBuffer = (staticBufferNdx != 0);

									DrawCallBatchingTest::TestSpec spec;

									spec.useStaticBuffer		= useStaticBuffer;
									spec.staticAttributeCount	= staticAttributeCount;

									spec.useDynamicBuffer		= useDynamicBuffer;
									spec.dynamicAttributeCount	= dynamicAttributeCount;

									spec.drawCallCount			= drawCallCount;
									spec.triangleCount			= triangleCount;

									spec.useDrawElements		= drawElements;
									spec.useIndexBuffer			= useIndexBuffer;
									spec.dynamicIndices			= dynamicIndices;

									if (spec.useStaticBuffer && spec.staticAttributeCount == 0)
										continue;

									if (spec.useDynamicBuffer && spec.dynamicAttributeCount == 0)
										continue;

									attributeCountGroup->addChild(new DrawCallBatchingTest(m_context, specToName(spec).c_str(), specToDescrpition(spec).c_str(), spec));
								}
							}
						}
					}
				}
			}
		}
	}
}